

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_3::DepthRangeEvaluator::evaluate
          (DepthRangeEvaluator *this,ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  long lVar3;
  float afStack_2c [5];
  int local_18 [6];
  
  fVar1 = this->m_params->zNear;
  fVar2 = this->m_params->zFar;
  afStack_2c[2] = 1.0;
  if (fVar1 <= 1.0) {
    afStack_2c[2] = fVar1;
  }
  afStack_2c[2] = (float)(-(uint)(0.0 < fVar1) & (uint)afStack_2c[2]);
  afStack_2c[3] = 1.0;
  if (fVar2 <= 1.0) {
    afStack_2c[3] = fVar2;
  }
  afStack_2c[3] = (float)(-(uint)(0.0 < fVar2) & (uint)afStack_2c[3]);
  afStack_2c[4] = (afStack_2c[3] - afStack_2c[2]) * 0.5 + 0.5;
  local_18[2] = 0;
  local_18[3] = 1;
  local_18[4] = 2;
  lVar3 = 2;
  do {
    (c->color).m_data[local_18[lVar3]] = afStack_2c[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

void evaluate (gls::ShaderEvalContext& c)
	{
		float zNear	= deFloatClamp(m_params.zNear, 0.0f, 1.0f);
		float zFar	= deFloatClamp(m_params.zFar, 0.0f, 1.0f);
		float diff	= zFar - zNear;
		c.color.xyz() = tcu::Vec3(zNear, zFar, diff*0.5f + 0.5f);
	}